

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.cpp
# Opt level: O2

void __thiscall Spi::flash_prog(Spi *this,int addr,uint8_t *data,int n)

{
  undefined8 uVar1;
  uint uVar2;
  ulong uVar3;
  uint8_t command [4];
  
  if (this->verbose == true) {
    fprintf(_stdout,"prog 0x%06X +0x%03X..\n",addr,(ulong)(uint)n);
  }
  flash_chip_select(this);
  send_spi(this,command,4);
  send_spi(this,data,n);
  flash_chip_deselect(this);
  if (this->verbose == true) {
    uVar2 = n;
    if (n < 1) {
      uVar2 = 0;
    }
    for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      uVar1 = 0x20;
      if ((~(uint)uVar3 & 0x1f) == 0) {
        uVar1 = 10;
      }
      if (n - 1 == uVar3) {
        uVar1 = 10;
      }
      fprintf(_stderr,"%02x%c",(ulong)data[uVar3],uVar1);
    }
  }
  return;
}

Assistant:

void Spi::flash_prog(int addr, uint8_t *data, int n) {
	if (verbose)
		fprintf(stdout, "prog 0x%06X +0x%03X..\n", addr, n);

	uint8_t command[4] = { FC_PP, (uint8_t) (addr >> 16), (uint8_t) (addr >> 8),
			(uint8_t) addr };

	flash_chip_select();
	send_spi(command, 4);
	send_spi(data, n);
	flash_chip_deselect();

	if (verbose)
		for (int i = 0; i < n; i++)
			fprintf(stderr, "%02x%c", data[i],
					i == n - 1 || i % 32 == 31 ? '\n' : ' ');
}